

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eq2degComp.cpp
# Opt level: O3

void __thiscall Eq2degComp::computeRoots(Eq2degComp *this)

{
  pointer *ppcVar1;
  iterator iVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  complex<double> local_38;
  double local_28;
  undefined8 uStack_20;
  double local_18;
  
  local_38._M_value = (_ComplexT)ZEXT816(0);
  dVar3 = *(double *)&this->field_0x20;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    uStack_20 = 0x8000000000000000;
    uVar6 = 0;
    local_28 = -*(double *)&this->field_0x10;
    local_18 = dVar3;
    dVar3 = csqrt(dVar3);
    auVar8._0_8_ = local_28 - dVar3;
    auVar8._8_8_ = uVar6 ^ 0x8000000000000000;
    auVar4._0_8_ = *(double *)&this->field_0x8 + *(double *)&this->field_0x8;
    auVar4._8_8_ = auVar4._0_8_;
    local_38._M_value = (_ComplexT)divpd(auVar8,auVar4);
    iVar2._M_current =
         (this->m_rac).
         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_rac).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      _M_realloc_insert<std::complex<double>const&>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&this->m_rac,
                 iVar2,&local_38);
    }
    else {
      *(undefined8 *)(iVar2._M_current)->_M_value = local_38._M_value._0_8_;
      *(undefined8 *)((iVar2._M_current)->_M_value + 8) = local_38._M_value._8_8_;
      ppcVar1 = &(this->m_rac).
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    local_28 = *(double *)&this->field_0x10;
    uVar7 = 0;
    dVar3 = csqrt(local_18);
    auVar5._0_8_ = dVar3 - local_28;
    auVar9._0_8_ = *(double *)&this->field_0x8 + *(double *)&this->field_0x8;
    auVar5._8_8_ = uVar7;
    auVar9._8_8_ = auVar9._0_8_;
    local_38._M_value = (_ComplexT)divpd(auVar5,auVar9);
    iVar2._M_current =
         (this->m_rac).
         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current !=
        (this->m_rac).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_00102480;
  }
  else {
    local_38._M_value._8_8_ = 0;
    local_38._M_value._0_8_ =
         -*(double *)&this->field_0x10 / (*(double *)&this->field_0x8 + *(double *)&this->field_0x8)
    ;
    iVar2._M_current =
         (this->m_rac).
         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current !=
        (this->m_rac).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
LAB_00102480:
      *(undefined8 *)(iVar2._M_current)->_M_value = local_38._M_value._0_8_;
      *(undefined8 *)((iVar2._M_current)->_M_value + 8) = local_38._M_value._8_8_;
      ppcVar1 = &(this->m_rac).
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
      return;
    }
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_realloc_insert<std::complex<double>const&>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&this->m_rac,iVar2
             ,&local_38);
  return;
}

Assistant:

void Eq2degComp::computeRoots(){
    std::complex<double> zRoot;
    std::complex<double> zDelta = m_delta;
    if (m_delta == 0){
        zRoot = -m_b/(2*m_a);
        m_rac.push_back(zRoot);
    }else{
        zRoot = (-m_b-sqrt(zDelta))/(2*m_a);
        m_rac.push_back(zRoot);
        zRoot = (-m_b+sqrt(zDelta))/(2*m_a);
        m_rac.push_back(zRoot);
    }
}